

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O0

long attk_protection(int aatyp)

{
  long w_mask;
  int aatyp_local;
  
  if (aatyp == 0) {
    return -1;
  }
  if (aatyp == 1) {
    return 0x10;
  }
  if (aatyp != 2) {
    if (aatyp == 3) {
      return 0x20;
    }
    if (aatyp == 4) {
      return 4;
    }
    if (aatyp == 5) {
      return 0x10;
    }
    if (aatyp != 6) {
      if (aatyp == 7) {
        return 0x12;
      }
      if (aatyp == 10) {
        return -1;
      }
      if (aatyp != 0xb) {
        if (aatyp - 0xcU < 4) {
          return -1;
        }
        if (aatyp != 0x10) {
          if (aatyp == 0xfe) {
            return 0x10;
          }
          if (aatyp == 0xff) {
            return -1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

long attk_protection(int aatyp)
{
    long w_mask = 0L;

    switch (aatyp) {
    case AT_NONE:
    case AT_SPIT:
    case AT_EXPL:
    case AT_BOOM:
    case AT_GAZE:
    case AT_BREA:
    case AT_MAGC:
	w_mask = ~0L;		/* special case; no defense needed */
	break;
    case AT_CLAW:
    case AT_TUCH:
    case AT_WEAP:
	w_mask = W_ARMG;	/* caller needs to check for weapon */
	break;
    case AT_KICK:
	w_mask = W_ARMF;
	break;
    case AT_BUTT:
	w_mask = W_ARMH;
	break;
    case AT_HUGS:
	w_mask = (W_ARMC|W_ARMG); /* attacker needs both to be protected */
	break;
    case AT_BITE:
    case AT_STNG:
    case AT_ENGL:
    case AT_TENT:
    default:
	w_mask = 0L;		/* no defense available */
	break;
    }
    return w_mask;
}